

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

int32_t __thiscall wasm::WasmBinaryReader::getS32LEB(WasmBinaryReader *this)

{
  size_t in_RCX;
  void *in_RDX;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  LEB<int,_signed_char> local_14 [2];
  S32LEB ret;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<signed_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:2046:12)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<signed_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:2046:12)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  LEB<int,_signed_char>::read(local_14,(int)&local_38,in_RDX,in_RCX);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return local_14[0].value;
}

Assistant:

int32_t WasmBinaryReader::getS32LEB() {
  S32LEB ret;
  ret.read([&]() { return (int8_t)getInt8(); });
  return ret.value;
}